

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O0

NaReal __thiscall
NaNNUnit::ScaleData(NaNNUnit *this,NaScaler *rSrcScaler,NaScaler *rDstScaler,NaReal fSrcVal,
                   uint iIndex)

{
  NaVector *in_XMM0_Qa;
  NaReal NVar1;
  NaReal NVar2;
  double dVar3;
  double dVar4;
  NaReal fDstVal;
  NaReal fSrcDiff;
  NaReal fDstDiff;
  uint in_stack_ffffffffffffff9c;
  NaVector *in_stack_ffffffffffffffa0;
  NaVector *local_40;
  
  NVar1 = NaVector::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  NVar2 = NaVector::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  dVar3 = NVar1 - NVar2;
  NVar1 = NaVector::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  NVar2 = NaVector::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  dVar4 = NVar1 - NVar2;
  local_40 = in_XMM0_Qa;
  if (((dVar3 != 0.0) || (NAN(dVar3))) && ((dVar4 != 0.0 || (NAN(dVar4))))) {
    NVar1 = NaVector::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    NVar2 = NaVector::operator()(in_XMM0_Qa,in_stack_ffffffffffffff9c);
    local_40 = (NaVector *)(NVar1 + (((double)in_XMM0_Qa - NVar2) * dVar3) / dVar4);
  }
  return (NaReal)local_40;
}

Assistant:

NaReal
NaNNUnit::ScaleData (const NaNNUnit::NaScaler& rSrcScaler,
                     const NaNNUnit::NaScaler& rDstScaler,
                     NaReal fSrcVal,
		     unsigned iIndex) const
{
  NaReal  fDstDiff = rDstScaler.max(iIndex) - rDstScaler.min(iIndex);
  NaReal  fSrcDiff = rSrcScaler.max(iIndex) - rSrcScaler.min(iIndex);
  NaReal  fDstVal = fSrcVal;

  // Preveint scaling if some difference is zero
  if(0 != fDstDiff && 0 != fSrcDiff)
    {
      fDstVal = rDstScaler.min(iIndex)
	+ (fSrcVal - rSrcScaler.min(iIndex)) * fDstDiff / fSrcDiff;
    }

#if defined(NNUnit_SCALE)
  NaPrintLog("ScaleData(%u) [%g,%g]->[%g,%g] ==> %g -> %g\n", iIndex,
	     rSrcScaler.min(iIndex), rSrcScaler.max(iIndex),
	     rDstScaler.min(iIndex), rDstScaler.max(iIndex),
	     fSrcVal, fDstVal);
#endif // NNUnit_SCALE
  return fDstVal;
}